

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_13::NameApplier::OnTableCopyExpr(NameApplier *this,TableCopyExpr *expr)

{
  Result RVar1;
  Enum EVar2;
  
  RVar1 = UseNameForTableVar(this,&expr->dst_table);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    RVar1 = UseNameForTableVar(this,&expr->src_table);
    EVar2 = (Enum)(RVar1.enum_ == Error);
  }
  return (Result)EVar2;
}

Assistant:

Result NameApplier::OnTableCopyExpr(TableCopyExpr* expr) {
  CHECK_RESULT(UseNameForTableVar(&expr->dst_table));
  CHECK_RESULT(UseNameForTableVar(&expr->src_table));
  return Result::Ok;
}